

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O3

void al_destroy_path(ALLEGRO_PATH *path)

{
  undefined8 *puVar1;
  ulong uVar2;
  uint uVar3;
  
  if (path != (ALLEGRO_PATH *)0x0) {
    if (path->drive != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->drive);
      path->drive = (ALLEGRO_USTR *)0x0;
    }
    if (path->filename != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->filename);
      path->filename = (ALLEGRO_USTR *)0x0;
    }
    if ((path->segments)._size != 0) {
      uVar3 = 1;
      do {
        puVar1 = (undefined8 *)_al_vector_ref(&path->segments,uVar3 - 1);
        al_ustr_free((ALLEGRO_USTR *)*puVar1);
        uVar2 = (ulong)uVar3;
        uVar3 = uVar3 + 1;
      } while (uVar2 < (path->segments)._size);
    }
    _al_vector_free(&path->segments);
    if (path->basename != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->basename);
      path->basename = (ALLEGRO_USTR *)0x0;
    }
    if (path->full_string != (ALLEGRO_USTR *)0x0) {
      al_ustr_free(path->full_string);
      path->full_string = (ALLEGRO_USTR *)0x0;
    }
    al_free_with_context
              (path,0x1ce,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/path.c"
               ,"al_destroy_path");
    return;
  }
  return;
}

Assistant:

void al_destroy_path(ALLEGRO_PATH *path)
{
   unsigned i;

   if (!path) {
      return;
   }

   if (path->drive) {
      al_ustr_free(path->drive);
      path->drive = NULL;
   }

   if (path->filename) {
      al_ustr_free(path->filename);
      path->filename = NULL;
   }

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      al_ustr_free(get_segment(path, i));
   }
   _al_vector_free(&path->segments);

   if (path->basename) {
      al_ustr_free(path->basename);
      path->basename = NULL;
   }

   if (path->full_string) {
      al_ustr_free(path->full_string);
      path->full_string = NULL;
   }

   al_free(path);
}